

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O1

void __thiscall libDAI::BoxBP::run(BoxBP *this,FactorGraph *fg,size_t maxiter)

{
  size_t sVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  size_type __n;
  size_t iI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> edge_seq;
  VarSet local_b0;
  size_t local_90;
  Box local_88;
  
  local_90 = maxiter;
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::_M_erase_at_end
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this,*(pointer *)this);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::reserve
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this,
             (long)(fg->_fg)._E12.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(fg->_fg)._E12.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar3 = (fg->_fg)._E12.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((fg->_fg)._E12.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppVar3) {
    __n = 0;
  }
  else {
    lVar6 = 0;
    uVar4 = 0;
    do {
      iVar2 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])
                        (fg,*(undefined8 *)((long)&ppVar3->first + lVar6));
      VarSet::VarSet(&local_b0,(Var *)CONCAT44(extraout_var,iVar2));
      Box::Box(&local_88,&local_b0);
      std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::emplace_back<libDAI::Box>
                ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)this,&local_88);
      if (local_88._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_88._max._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88._max._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_88._min._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88._min._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88._vars._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88._vars._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88._vars._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
      ppVar3 = (fg->_fg)._E12.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)(fg->_fg)._E12.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4;
      lVar6 = lVar6 + 0x10;
    } while (uVar4 < __n);
  }
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,__n);
  local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((fg->_fg)._E12.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (fg->_fg)._E12.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      if (local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                   (iterator)
                   local_88._vars._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish,(unsigned_long *)&local_b0);
      }
      else {
        *(pointer *)
         local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_finish =
             local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_88._vars._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_finish + 8);
      }
      local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&(local_b0._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start)->_label + 1);
    } while (local_b0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)((long)(fg->_fg)._E12.
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(fg->_fg)._E12.
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  sVar1 = local_90;
  if (local_90 != 0) {
    sVar5 = 0;
    do {
      if ((fg->_fg)._E12.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (fg->_fg)._E12.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iI = 0;
        do {
          calcNewBox(this,fg,iI);
          iI = iI + 1;
        } while (iI < (ulong)((long)(fg->_fg)._E12.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(fg->_fg)._E12.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != sVar1);
  }
  if (local_88._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._vars._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BoxBP::run( const FactorGraph &fg, size_t maxiter ) {
        _boxes.clear();
        _boxes.reserve( fg.nrEdges() );
        for( size_t iI = 0; iI < fg.nrEdges(); iI++ ) {
            size_t i = fg.edge(iI).first;
            _boxes.push_back( Box( fg.var(i) ) );
        }
        
        vector<size_t> edge_seq;
        edge_seq.reserve( fg.nrEdges() );
        for( size_t e = 0; e < fg.nrEdges(); e++ )
            edge_seq.push_back( e );

        for( size_t iter = 0; iter < maxiter; iter++ ) {
            for( size_t t = 0; t < fg.nrEdges(); t++ )
                calcNewBox(fg, t);
        }
    }